

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

Value * __thiscall
optimization::common_expr_del::BlockNodes::convert_operand_to_value
          (Value *__return_storage_ptr__,BlockNodes *this,Operand *operand)

{
  char cVar1;
  element_type *peVar2;
  variant_alternative_t<1UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar3;
  variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar4;
  anon_class_8_1_a78179b7_conflict local_18;
  
  if ((operand->
      super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      .
      super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
      ._M_index == '\0') {
    pvVar4 = std::get<0ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>(operand);
    *(variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *)
     &__return_storage_ptr__->field_0x8 = *pvVar4;
    __return_storage_ptr__->field_0x18 = 0;
    (__return_storage_ptr__->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ecf98;
    __return_storage_ptr__->shift = Lsl;
    __return_storage_ptr__->shift_amount = '\0';
  }
  else {
    pvVar3 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>(operand);
    peVar2 = (this->nodes).
             super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[pvVar3->id].
             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_18.__lhs =
         (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&__return_storage_ptr__->field_0x8;
    cVar1 = *(char *)((long)&peVar2->mainVar + 0x18);
    __return_storage_ptr__->field_0x18 = cVar1;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
      ::_S_vtable._M_arr[(long)cVar1 + 1]._M_data)
              (&local_18,(variant<int,_mir::inst::VarId> *)((long)&peVar2->mainVar + 8));
    (__return_storage_ptr__->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ecf98;
    *(undefined2 *)&__return_storage_ptr__->shift = *(undefined2 *)((long)&peVar2->mainVar + 0x19);
  }
  return __return_storage_ptr__;
}

Assistant:

mir::inst::Value convert_operand_to_value(Operand operand) {
    if (operand.index() == 0) {
      auto imm = std::get<int>(operand);
      return imm;
    } else {
      auto nodeId = std::get<NodeId>(operand);
      return nodes[nodeId.id]->mainVar;
    }
  }